

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManElaBestMatchOne
               (Nf_Man_t *p,int iObj,int c,int *pCut,int *pCutSet,Nf_Mat_t *pRes,int Required)

{
  int iVar1;
  uint uVar2;
  Vec_Wec_t *pVVar3;
  Nf_Obj_t *pNVar4;
  uint uVar5;
  word wVar6;
  byte bVar7;
  uint uVar8;
  Nf_Mat_t *pMb;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  bool bVar15;
  float fVar16;
  Nf_Obj_t *pBestF [6];
  Nf_Mat_t local_c8;
  int local_ac;
  uint local_a8;
  uint local_a4;
  Nf_Mat_t *local_a0;
  Nf_Man_t *local_98;
  int local_8c;
  int *local_88;
  int *local_80;
  long local_78;
  ulong local_70;
  long alStack_68 [7];
  
  uVar5 = *pCut;
  pVVar3 = p->vTt2Match;
  local_a0 = pRes;
  local_98 = p;
  local_8c = iObj;
  if (pVVar3->nSize <= (int)(uVar5 >> 6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  uVar8 = uVar5 & 0x1f;
  if (uVar8 != 0) {
    pNVar4 = p->pNfObjs;
    uVar9 = 0;
    do {
      alStack_68[uVar9] = (long)(pNVar4 + pCut[uVar9 + 1]);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  uVar11 = uVar5 >> 5;
  lVar10 = (long)&pVVar3->pArray->nCap + (ulong)((uVar5 >> 6) << 4);
  local_c8._0_8_ = 0;
  local_c8.D = 0x3fffffff;
  local_c8.F = 3.4028235e+38;
  if (uVar8 == 0) {
    if (0x3f < uVar5) {
      __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x6f4,
                    "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)"
                   );
    }
    uVar5 = (uint)(uVar11 == 1) ^ c;
    fVar16 = p->pCells[(int)uVar5].AreaF;
    local_c8._8_8_ = (ulong)(uint)fVar16 << 0x20;
    if (pCut <= pCutSet) {
LAB_00780368:
      __assert_fail("pCut > pCutSet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x93,"int Nf_CutHandle(int *, int *)");
    }
    if ((fVar16 + 0.001 < pRes->F) || ((fVar16 + -0.001 < pRes->F && (0 < pRes->D)))) {
      *(uint *)pRes = (uVar5 & 0xfffff | ((int)pCut - (int)pCutSet & 0xffcU) << 0x12) + 0x80000000;
      pRes->Cfg = (Nf_Cfg_t)0x0;
      pRes->D = local_c8.D;
      pRes->F = local_c8.F;
    }
  }
  else if (1 < *(int *)(lVar10 + 4)) {
    local_ac = 0;
    local_70 = (ulong)(((int)pCut - (int)pCutSet & 0xffcU) << 0x12);
    lVar13 = 0;
    local_a8 = uVar11;
    local_a4 = c;
    local_88 = pCutSet;
    local_80 = pCut;
    local_78 = lVar10;
    do {
      iVar1 = *(int *)(*(long *)(lVar10 + 8) + lVar13 * 4);
      uVar5 = *(uint *)&local_98->pCells[iVar1].field_0x10;
      if (uVar8 != uVar5 >> 0x1c) {
        __assert_fail("nFans == (int)pC->nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x708,
                      "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)"
                     );
      }
      uVar2 = *(uint *)(*(long *)(lVar10 + 8) + 4 + lVar13 * 4);
      if (((uVar2 ^ uVar11) & 1) == c) {
        bVar15 = true;
        bVar7 = 0;
        uVar9 = 0;
        iVar14 = 0;
        do {
          lVar10 = (ulong)(((uVar2 >> 1 & 0x7f) >> ((uint)uVar9 & 0x1f) & 1) != 0) * 0x20;
          if (-1 < *(int *)(alStack_68[(uVar2 >> 8) >> (bVar7 & 0x1f) & 0xf] + lVar10)) {
            __assert_fail("pMd->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                          ,0x70e,
                          "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)"
                         );
          }
          iVar12 = local_98->pCells[iVar1].iDelays[uVar9] +
                   *(int *)(alStack_68[(uVar2 >> 8) >> (bVar7 & 0x1f) & 0xf] + lVar10 + 8);
          if (iVar14 <= iVar12) {
            iVar14 = iVar12;
          }
          if (Required < iVar14) break;
          uVar9 = uVar9 + 1;
          bVar15 = uVar9 < uVar8;
          bVar7 = bVar7 + 4;
        } while (uVar8 != uVar9);
        lVar10 = local_78;
        c = local_a4;
        uVar11 = local_a8;
        if (!bVar15) {
          local_c8.F = 3.4028235e+38;
          local_c8.D = iVar14;
          local_c8._0_8_ = CONCAT44(local_c8.Cfg,local_ac) & 0xffffffff3fffffff | 0x80000000;
          if (local_80 <= local_88) goto LAB_00780368;
          local_ac = (uVar5 & 0xfffff) + (int)local_70 + -0x80000000;
          local_c8._0_8_ = CONCAT44(uVar2,local_ac) & 0xfffffffeffffffff;
          wVar6 = Nf_MatchRefArea(local_98,local_8c,local_a4,&local_c8,Required);
          fVar16 = (float)(int)wVar6 / 1000.0;
          local_c8.F = fVar16;
          lVar10 = local_78;
          uVar11 = local_a8;
          if ((fVar16 + 0.001 < local_a0->F) ||
             ((fVar16 + -0.001 < local_a0->F && (iVar14 < local_a0->D)))) {
            *(undefined4 *)&local_a0->field_0x0 = local_c8._0_4_;
            local_a0->Cfg = local_c8.Cfg;
            local_a0->D = local_c8.D;
            local_a0->F = fVar16;
          }
        }
      }
      lVar13 = lVar13 + 2;
    } while ((int)((uint)lVar13 | 1) < *(int *)(lVar10 + 4));
  }
  return;
}

Assistant:

void Nf_ManElaBestMatchOne( Nf_Man_t * p, int iObj, int c, int * pCut, int * pCutSet, Nf_Mat_t * pRes, int Required )
{
    Nf_Mat_t Mb,*pMb = &Mb, * pMd;
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, Info, Offset, iFanin, fComplF;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // consider matches of this function
    memset( pMb, 0, sizeof(Nf_Mat_t) );
    pMb->D = SCL_INFINITY; pMb->F = FLT_MAX;
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        //printf( "Node %d(%d) is const\n", iObj, c );
        assert( iFuncLit == 0 || iFuncLit == 1 );
        pMb->D = 0;
        pMb->F = p->pCells[c ^ Const].AreaF;
        pMb->CutH = Nf_CutHandle(pCutSet, pCut);
        pMb->Gate = c ^ Const;
//        pMb->Conf = 0;
        pMb->Cfg = Nf_Int2Cfg(0);
        pMb->fBest = 1;
        // compare
        if ( pRes->F > pMb->F + NF_EPSILON || (pRes->F > pMb->F - NF_EPSILON && pRes->D > pMb->D) )
            *pRes = *pMb;
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        int Delay      = 0;
        assert( nFans == (int)pC->nFanins );
        if ( fCompl != c )
            continue;
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            pMd     = &pBestF[iFanin]->M[fComplF][0];
            assert( pMd->fBest );
            Delay = Abc_MaxInt( Delay, pMd->D + pC->iDelays[k] );
            if ( Delay > Required )
                break;
        }
        if ( k < nFans )
            continue;
        // create match
        pMb->D = Delay;
        pMb->F = FLT_MAX;
        pMb->fBest = 1;
        pMb->fCompl = 0;
        pMb->CutH = Nf_CutHandle(pCutSet, pCut);
        pMb->Gate = pC->Id;
        pMb->Cfg = Cfg;
        pMb->Cfg.fCompl = 0;
        // compute area
        pMb->F = Scl_Int2Flt((int)Nf_MatchRefArea(p, iObj, c, pMb, Required));
        // compare
        if ( pRes->F > pMb->F + NF_EPSILON || (pRes->F > pMb->F - NF_EPSILON && pRes->D > pMb->D) )
            *pRes = *pMb;
    }
}